

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

size_t xmlBufNodeDump(xmlBufPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format)

{
  xmlBufferAllocationScheme scheme;
  xmlOutputBufferPtr buf_00;
  size_t sVar1;
  size_t sVar2;
  int local_38;
  
  xmlInitParser();
  sVar1 = 0xffffffffffffffff;
  if (buf != (xmlBufPtr)0x0 && cur != (xmlNodePtr)0x0) {
    buf_00 = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      xmlSaveErrMemory("creating buffer");
    }
    else {
      buf_00->conv = (xmlBufPtr)0x0;
      buf_00->written = 0;
      buf_00->error = 0;
      buf_00->buffer = buf;
      buf_00->context = (void *)0x0;
      buf_00->writecallback = (xmlOutputWriteCallback)0x0;
      buf_00->closecallback = (xmlOutputCloseCallback)0x0;
      buf_00->encoder = (xmlCharEncodingHandlerPtr)0x0;
      sVar1 = xmlBufUse(buf);
      scheme = xmlBufGetAllocationScheme(buf);
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      xmlNodeDumpOutput(buf_00,doc,cur,level,format,(char *)0x0);
      xmlBufSetAllocationScheme(buf,scheme);
      (*xmlFree)(buf_00);
      sVar2 = xmlBufUse(buf);
      local_38 = (int)sVar1;
      sVar1 = (size_t)((int)sVar2 - local_38);
    }
  }
  return sVar1;
}

Assistant:

size_t
xmlBufNodeDump(xmlBufPtr buf, xmlDocPtr doc, xmlNodePtr cur, int level,
            int format)
{
    size_t use;
    int ret;
    xmlOutputBufferPtr outbuf;
    int oldalloc;

    xmlInitParser();

    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
                        "xmlNodeDump : node == NULL\n");
#endif
        return (-1);
    }
    if (buf == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
                        "xmlNodeDump : buf == NULL\n");
#endif
        return (-1);
    }
    outbuf = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (outbuf == NULL) {
        xmlSaveErrMemory("creating buffer");
        return (-1);
    }
    memset(outbuf, 0, (size_t) sizeof(xmlOutputBuffer));
    outbuf->buffer = buf;
    outbuf->encoder = NULL;
    outbuf->writecallback = NULL;
    outbuf->closecallback = NULL;
    outbuf->context = NULL;
    outbuf->written = 0;

    use = xmlBufUse(buf);
    oldalloc = xmlBufGetAllocationScheme(buf);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDumpOutput(outbuf, doc, cur, level, format, NULL);
    xmlBufSetAllocationScheme(buf, oldalloc);
    xmlFree(outbuf);
    ret = xmlBufUse(buf) - use;
    return (ret);
}